

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool skipheader;
  int iVar1;
  int seed;
  bool bVar2;
  allocator local_7a;
  allocator local_79;
  int local_78;
  uint local_74;
  string local_70;
  string local_50;
  
  skipheader = false;
  bVar2 = false;
  local_74 = 0;
  local_78 = 0;
  seed = 0;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"vhsrg:S:");
      if (iVar1 != 0x53) break;
      seed = atoi(_optarg);
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x67) {
      local_78 = atoi(_optarg);
      local_74 = (uint)CONCAT71((uint7)(uint3)((uint)local_78 >> 8),1);
    }
    else if (iVar1 == 0x72) {
      bVar2 = true;
    }
    else {
      if (iVar1 != 0x73) {
        if (iVar1 == 0x76) {
          fprintf(_stderr,"%s : version: %s\n",*argv,"");
        }
        else {
          help();
        }
        exit(1);
      }
      skipheader = true;
    }
  }
  std::__cxx11::string::string((string *)&local_50,"",&local_79);
  std::__cxx11::string::string((string *)&local_70,"",&local_7a);
  initstreams(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    doit(skipheader);
  }
  else if ((local_74 & 1) != 0) {
    genrandomnumbers(skipheader,local_78,seed);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	bool skipheader = false;
	bool bintorand = false;
	bool generaterandno = false;
	int totalrandno = 0;
	int seedval = 0;
	int opt;
	while ((opt = getopt(argc, argv, "vhsrg:S:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'r':
			bintorand = true;
			break;
		case 'g':
			generaterandno = true;
			totalrandno = atoi(optarg);
			break;
		case 'S':
			seedval = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}


	initstreams("", "");
	if (bintorand == true) {
		doit(skipheader);
		return EXIT_SUCCESS;
	}

	if (generaterandno == true) {
		genrandomnumbers(skipheader,totalrandno,seedval);
		return EXIT_SUCCESS;
	}
    
}